

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qx509_base.cpp
# Opt level: O2

QStringList * __thiscall
QTlsPrivate::X509CertificateBase::subjectInfo
          (QStringList *__return_storage_ptr__,X509CertificateBase *this,SubjectInfo info)

{
  long in_FS_OFFSET;
  QArrayDataPointer<char> QStack_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  subjectInfoToString((QByteArray *)&QStack_38,info);
  (**(code **)(*(long *)this + 0x50))(__return_storage_ptr__,this,&QStack_38);
  QArrayDataPointer<char>::~QArrayDataPointer(&QStack_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QStringList X509CertificateBase::subjectInfo(QSslCertificate::SubjectInfo info) const
{
    return subjectInfo(subjectInfoToString(info));
}